

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O0

void lws_dll2_add_sorted_priv
               (lws_dll2_t *d,lws_dll2_owner_t *own,void *priv,
               _func_int_void_ptr_lws_dll2_t_ptr_lws_dll2_t_ptr *compare3)

{
  int iVar1;
  lws_dll2 *plVar2;
  lws_dll2 *tp;
  lws_dll2 *p;
  _func_int_void_ptr_lws_dll2_t_ptr_lws_dll2_t_ptr *compare3_local;
  void *priv_local;
  lws_dll2_owner_t *own_local;
  lws_dll2_t *d_local;
  
  plVar2 = lws_dll2_get_head(own);
  while( true ) {
    tp = plVar2;
    if (tp == (lws_dll2 *)0x0) {
      lws_dll2_add_tail(d,own);
      return;
    }
    plVar2 = tp->next;
    if (tp == d) break;
    iVar1 = (*compare3)(priv,tp,d);
    if (-1 < iVar1) {
      lws_dll2_add_before(d,tp);
      return;
    }
  }
  __assert_fail("p != d",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/lws_dll2.c"
                ,0xda,
                "void lws_dll2_add_sorted_priv(lws_dll2_t *, lws_dll2_owner_t *, void *, int (*)(void *, const lws_dll2_t *, const lws_dll2_t *))"
               );
}

Assistant:

void
lws_dll2_add_sorted_priv(lws_dll2_t *d, lws_dll2_owner_t *own, void *priv,
			 int (*compare3)(void *priv, const lws_dll2_t *d,
					const lws_dll2_t *i))
{
	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
				   lws_dll2_get_head(own)) {
		assert(p != d);

		if (compare3(priv, p, d) >= 0) {
			/* drop us in before this guy */
			lws_dll2_add_before(d, p);

			return;
		}
	} lws_end_foreach_dll_safe(p, tp);

	/*
	 * Either nobody on the list yet to compare him to, or he's the
	 * furthest away timeout... stick him at the tail end
	 */

	lws_dll2_add_tail(d, own);
}